

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

int __thiscall
ctemplate::TemplateCache::Refcount(TemplateCache *this,TemplateCacheKey template_cache_key)

{
  second_type *psVar1;
  undefined8 in_RCX;
  pair<unsigned_long,_int> v;
  int local_70;
  CachedTemplate *it;
  ReaderMutexLock ml;
  TemplateCache *this_local;
  TemplateCacheKey template_cache_key_local;
  
  ml.mu_ = (Mutex *)this;
  ReaderMutexLock::ReaderMutexLock((ReaderMutexLock *)&it,this->mutex_);
  v._8_8_ = in_RCX;
  v.first = (ulong)(uint)template_cache_key.second;
  psVar1 = find_ptr<std::unordered_map<std::pair<unsigned_long,int>,ctemplate::TemplateCache::CachedTemplate,ctemplate::TemplateCache::TemplateCacheHash,std::equal_to<std::pair<unsigned_long,int>>,std::allocator<std::pair<std::pair<unsigned_long,int>const,ctemplate::TemplateCache::CachedTemplate>>>,std::pair<unsigned_long,int>>
                     ((ctemplate *)this->parsed_template_cache_,
                      (unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
                       *)template_cache_key.first,v);
  if (psVar1 == (second_type *)0x0) {
    local_70 = 0;
  }
  else {
    local_70 = RefcountedTemplate::refcount(psVar1->refcounted_tpl);
  }
  ReaderMutexLock::~ReaderMutexLock((ReaderMutexLock *)&it);
  return local_70;
}

Assistant:

int TemplateCache::Refcount(const TemplateCacheKey template_cache_key) const {
  ReaderMutexLock ml(mutex_);
  CachedTemplate* it = find_ptr(*parsed_template_cache_, template_cache_key);
  return it ? it->refcounted_tpl->refcount() : 0;
}